

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O0

_Bool COSE_Sign0_Sign_eckey(HCOSE_SIGN0 h,eckey_t_conflict *eckey,cose_errback *perr)

{
  _Bool _Var1;
  cn_cbor *pcVar2;
  cn_cbor *pcborProtected;
  COSE_Sign0Message *pMessage;
  cose_errback *perr_local;
  eckey_t_conflict *eckey_local;
  HCOSE_SIGN0 h_local;
  
  _Var1 = IsValidSign0Handle(h);
  if (_Var1) {
    pcVar2 = _COSE_encode_protected((COSE *)h,perr);
    if ((pcVar2 != (cn_cbor *)0x0) &&
       (_Var1 = _COSE_Signer0_sign((COSE_Sign0Message *)h,eckey,perr), _Var1)) {
      return true;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Sign0_Sign_eckey(HCOSE_SIGN0 h, const eckey_t * eckey, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
	// cn_cbor_context * context = NULL;
#endif
	COSE_Sign0Message * pMessage = (COSE_Sign0Message *)h;
	const cn_cbor * pcborProtected;

	if (!IsValidSign0Handle(h)) {
		CHECK_CONDITION(false, COSE_ERR_INVALID_HANDLE);
	errorReturn:
		return false;
	}
#ifdef USE_CBOR_CONTEXT
	//	context = &pMessage->m_message.m_allocContext;
#endif

	pcborProtected = _COSE_encode_protected(&pMessage->m_message, perr);
	if (pcborProtected == NULL) goto errorReturn;

	if (!_COSE_Signer0_sign(pMessage, eckey, perr)) goto errorReturn;

	return true;
}